

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O3

int __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::remove
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,char *__filename)

{
  DLPSV *pDVar1;
  DLPSV *pDVar2;
  DLPSV *in_RAX;
  
  pDVar1 = (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last;
  if ((this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first == (DLPSV *)__filename) {
    if (pDVar1 == (DLPSV *)__filename) {
      (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first = (DLPSV *)0x0;
    }
    else {
      in_RAX = *(DLPSV **)(__filename + 0x10);
      (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first = in_RAX;
      if (in_RAX != (DLPSV *)0x0) {
        return (int)in_RAX;
      }
    }
    (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last = (DLPSV *)0x0;
    return (int)in_RAX;
  }
  pDVar2 = *(DLPSV **)(__filename + 0x18);
  if (pDVar1 != (DLPSV *)__filename) {
    *(DLPSV **)(*(long *)(__filename + 0x10) + 0x18) = pDVar2;
    pDVar2->thenext = *(DLPSV **)(__filename + 0x10);
    return (int)pDVar2;
  }
  (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last = pDVar2;
  return (int)pDVar2;
}

Assistant:

void remove(T* elem)
   {
      if(elem == first())
      {
         this->the_first = next(elem);

         if(first() == nullptr)
            this->the_last = nullptr;
      }
      else if(elem == last())
         this->the_last = elem->prev();
      else
      {
         elem->next()->prev() = elem->prev();
         elem->prev()->next() = elem->next();
      }
   }